

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O0

void __thiscall tcmalloc::CentralFreeList::Init(CentralFreeList *this,size_t cl)

{
  SizeMap *this_00;
  int *piVar1;
  int local_38 [3];
  int32_t local_2c;
  int32_t objs_to_move;
  int32_t bytes;
  size_t cl_local;
  CentralFreeList *this_local;
  SizeMap *local_10;
  
  this->size_class_ = cl;
  _objs_to_move = cl;
  cl_local = (size_t)this;
  DLL_Init(&this->empty_);
  DLL_Init(&this->nonempty_);
  this->num_spans_ = 0;
  this->counter_ = 0;
  this->max_cache_size_ = 0x40;
  this->cache_size_ = 0x10;
  if (_objs_to_move != 0) {
    local_10 = Static::sizemap();
    this_local._4_4_ = (undefined4)_objs_to_move;
    local_2c = local_10->class_to_size_[_objs_to_move & 0xffffffff];
    this_00 = Static::sizemap();
    local_38[2] = SizeMap::num_objects_to_move(this_00,(uint32_t)_objs_to_move);
    local_38[1] = 1;
    local_38[0] = (int)(0x100000 / (long)(local_2c * local_38[2]));
    piVar1 = std::max<int>(local_38 + 1,local_38);
    piVar1 = std::min<int>(&this->max_cache_size_,piVar1);
    this->max_cache_size_ = *piVar1;
    piVar1 = std::min<int>(&this->cache_size_,&this->max_cache_size_);
    this->cache_size_ = *piVar1;
  }
  this->used_slots_ = 0;
  return;
}

Assistant:

void CentralFreeList::Init(size_t cl) {
  size_class_ = cl;
  tcmalloc::DLL_Init(&empty_);
  tcmalloc::DLL_Init(&nonempty_);
  num_spans_ = 0;
  counter_ = 0;

  max_cache_size_ = kMaxNumTransferEntries;
#ifdef TCMALLOC_SMALL_BUT_SLOW
  // Disable the transfer cache for the small footprint case.
  cache_size_ = 0;
#else
  cache_size_ = 16;
#endif
  if (cl > 0) {
    // Limit the maximum size of the cache based on the size class.  If this
    // is not done, large size class objects will consume a lot of memory if
    // they just sit in the transfer cache.
    int32_t bytes = Static::sizemap()->ByteSizeForClass(cl);
    int32_t objs_to_move = Static::sizemap()->num_objects_to_move(cl);

    ASSERT(objs_to_move > 0 && bytes > 0);
    // Limit each size class cache to at most 1MB of objects or one entry,
    // whichever is greater. Total transfer cache memory used across all
    // size classes then can't be greater than approximately
    // 1MB * kMaxNumTransferEntries.
    max_cache_size_ = std::min(max_cache_size_,
                               std::max(1, (1024 * 1024) / (bytes * objs_to_move)));
    cache_size_ = std::min(cache_size_, max_cache_size_);
  }
  used_slots_ = 0;
  ASSERT(cache_size_ <= max_cache_size_);
}